

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strljustify_s.c
# Opt level: O1

errno_t strljustify_s(char *dest,rsize_t dmax)

{
  long lVar1;
  rsize_t rVar2;
  long lVar3;
  char cVar4;
  errno_t error;
  errno_t eVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (dest == (char *)0x0) {
    pcVar6 = "strljustify_s_s: dest is null";
    eVar5 = 400;
    error = 400;
  }
  else if (dmax == 0) {
    pcVar6 = "strljustify_s_s: dmax is 0";
    eVar5 = 0x191;
    error = 0x191;
  }
  else {
    if (dmax < 0x10000001) {
      if ((dmax == 1) || (*dest == '\0')) {
        *dest = '\0';
        eVar5 = 0;
      }
      else {
        if (*dest != '\0') {
          rVar2 = 0;
          do {
            if (dmax == rVar2) {
              memset(dest,0,dmax);
              pcVar6 = "strljustify_s: dest is unterminated";
              eVar5 = 0x197;
              error = 0x197;
              goto LAB_00105e82;
            }
            lVar3 = rVar2 + 1;
            rVar2 = rVar2 + 1;
          } while (dest[lVar3] != '\0');
        }
        lVar3 = 0;
        while( true ) {
          cVar4 = dest[lVar3];
          if ((cVar4 != ' ') && (cVar4 != '\t')) break;
          lVar3 = lVar3 + 1;
        }
        eVar5 = 0;
        if (cVar4 != '\0' && lVar3 != 0) {
          cVar4 = dest[lVar3];
          if (cVar4 != '\0') {
            pcVar6 = dest + lVar3 + 1;
            do {
              *dest = cVar4;
              dest = dest + 1;
              pcVar6[-1] = ' ';
              cVar4 = *pcVar6;
              pcVar6 = pcVar6 + 1;
            } while (cVar4 != '\0');
          }
          *dest = '\0';
        }
      }
      goto LAB_00105e87;
    }
    pcVar6 = "strljustify_s_s: dmax exceeds max";
    eVar5 = 0x193;
    error = 0x193;
  }
LAB_00105e82:
  invoke_safe_str_constraint_handler(pcVar6,(void *)0x0,error);
LAB_00105e87:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return eVar5;
  }
  __stack_chk_fail();
}

Assistant:

errno_t
strljustify_s (char *dest, rsize_t dmax)
{
    char *orig_dest;
    rsize_t orig_dmax;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strljustify_s_s: "
                   "dest is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (dmax == 0 ) {
        invoke_safe_str_constraint_handler("strljustify_s_s: "
                   "dmax is 0",
                   NULL, ESZEROL);
        return (ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strljustify_s_s: "
                   "dmax exceeds max",
                   NULL, ESLEMAX);
        return (ESLEMAX);
    }

    /*
     * corner case, a dmax of one allows only for a null
     */
    if (*dest == '\0' || dmax <= RSIZE_MIN_STR) {
        *dest = '\0';
        return (EOK);
    }

    orig_dmax = dmax;
    orig_dest = dest;

     /*
      * scan the string to be sure it is properly terminated
      */
     while (*dest) {
        if (dmax == 0) {
            while (orig_dmax) { *orig_dest++ = '\0';  orig_dmax--; }

            invoke_safe_str_constraint_handler(
                      "strljustify_s: dest is unterminated",
                       NULL, ESUNTERM);
            return (ESUNTERM);
        }
        dmax--;
        dest++;
    }

    /*
     * find first non-white space char
     */
    dest = orig_dest;
    while ((*dest == ' ') || (*dest == '\t')) {
        dest++;
    }

   /*
    * shift text, removing spaces, to left justify
    */
    if (orig_dest != dest && *dest) {
        while (*dest) {
            *orig_dest++ = *dest;
            *dest++ = ' ';
        }
        *orig_dest = '\0';
    }

    return (EOK);
}